

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>::int_writer<unsigned_int,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<3>_>
          *f)

{
  wchar_t wVar1;
  ulong uVar2;
  wchar_t *pwVar3;
  wchar_t __tmp;
  ulong uVar4;
  wchar_t wVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar10 = (ulong)spec->width_;
  uVar6 = f->size_;
  lVar11 = uVar6 - uVar10;
  if (uVar10 <= uVar6) {
LAB_00203523:
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
                  *)f,(truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *)this);
    return;
  }
  wVar1 = spec->fill_;
  uVar13 = uVar10 - uVar6;
  if (spec->align_ == ALIGN_CENTER) {
    uVar12 = uVar13 >> 1;
    pwVar3 = *(wchar_t **)this;
    uVar2 = *(ulong *)(this + 8);
    uVar4 = *(ulong *)(this + 0x10);
    wVar5 = *(wchar_t *)(this + 0x18);
    uVar7 = uVar4;
    uVar9 = uVar12;
    if (1 < uVar13) {
      do {
        if (uVar7 < uVar2) {
          *pwVar3 = wVar1;
          lVar11 = 4;
        }
        else {
          lVar11 = 0;
          wVar5 = wVar1;
        }
        pwVar3 = (wchar_t *)((long)pwVar3 + lVar11);
        uVar9 = uVar9 - 1;
        uVar7 = uVar7 + 1;
      } while (uVar9 != 0);
      uVar4 = uVar4 + uVar12;
    }
    *(wchar_t **)this = pwVar3;
    *(ulong *)(this + 8) = uVar2;
    *(ulong *)(this + 0x10) = uVar4;
    *(wchar_t *)(this + 0x18) = wVar5;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
                  *)f,(truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *)this);
    pwVar3 = *(wchar_t **)this;
    uVar2 = *(ulong *)(this + 8);
    uVar4 = *(ulong *)(this + 0x10);
    wVar5 = *(wchar_t *)(this + 0x18);
    uVar13 = uVar13 - uVar12;
    if (uVar13 == 0) goto LAB_00203617;
    lVar11 = (uVar6 + uVar12) - uVar10;
    uVar6 = uVar4;
    do {
      if (uVar6 < uVar2) {
        *pwVar3 = wVar1;
        lVar8 = 4;
      }
      else {
        lVar8 = 0;
        wVar5 = wVar1;
      }
      uVar6 = uVar6 + 1;
      pwVar3 = (wchar_t *)((long)pwVar3 + lVar8);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pwVar3 = *(wchar_t **)this;
      uVar2 = *(ulong *)(this + 8);
      uVar4 = *(ulong *)(this + 0x10);
      wVar5 = *(wchar_t *)(this + 0x18);
      if (uVar13 != 0) {
        lVar11 = uVar6 - uVar10;
        uVar6 = uVar4;
        do {
          if (uVar6 < uVar2) {
            *pwVar3 = wVar1;
            lVar8 = 4;
          }
          else {
            lVar8 = 0;
            wVar5 = wVar1;
          }
          uVar6 = uVar6 + 1;
          pwVar3 = (wchar_t *)((long)pwVar3 + lVar8);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0);
        uVar4 = uVar4 + uVar13;
      }
      *(wchar_t **)this = pwVar3;
      *(ulong *)(this + 8) = uVar2;
      *(ulong *)(this + 0x10) = uVar4;
      *(wchar_t *)(this + 0x18) = wVar5;
      goto LAB_00203523;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
                  *)f,(truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *)this);
    pwVar3 = *(wchar_t **)this;
    uVar2 = *(ulong *)(this + 8);
    uVar4 = *(ulong *)(this + 0x10);
    wVar5 = *(wchar_t *)(this + 0x18);
    uVar6 = uVar4;
    if (uVar13 == 0) goto LAB_00203617;
    do {
      if (uVar6 < uVar2) {
        *pwVar3 = wVar1;
        lVar8 = 4;
      }
      else {
        lVar8 = 0;
        wVar5 = wVar1;
      }
      pwVar3 = (wchar_t *)((long)pwVar3 + lVar8);
      lVar11 = lVar11 + 1;
      uVar6 = uVar6 + 1;
    } while (lVar11 != 0);
  }
  uVar4 = uVar4 + uVar13;
LAB_00203617:
  *(wchar_t **)this = pwVar3;
  *(ulong *)(this + 8) = uVar2;
  *(ulong *)(this + 0x10) = uVar4;
  *(wchar_t *)(this + 0x18) = wVar5;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }